

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O0

void hpa_dalloc(tsdn_t *tsdn,pai_t *self,edata_t *edata,_Bool *deferred_work_generated)

{
  edata_t *in_RDX;
  edata_list_active_t *in_RSI;
  pai_t *in_RDI;
  edata_list_active_t dalloc_list;
  edata_list_active_t aeStack_28 [2];
  
  edata_list_active_init(aeStack_28);
  edata_list_active_append(aeStack_28,in_RDX);
  hpa_dalloc_batch((tsdn_t *)dalloc_list.head.qlh_first,in_RDI,in_RSI,(_Bool *)in_RDX);
  return;
}

Assistant:

static void
hpa_dalloc(tsdn_t *tsdn, pai_t *self, edata_t *edata,
    bool *deferred_work_generated) {
	assert(!edata_guarded_get(edata));
	/* Just a dalloc_batch of size 1; this lets us share logic. */
	edata_list_active_t dalloc_list;
	edata_list_active_init(&dalloc_list);
	edata_list_active_append(&dalloc_list, edata);
	hpa_dalloc_batch(tsdn, self, &dalloc_list, deferred_work_generated);
}